

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

Mvc_Cover_t * Mvc_CoverCofactor(Mvc_Cover_t *p,int iValue,int iValueOther)

{
  int *piVar1;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  Mvc_Cube_t *pCube;
  Mvc_List_t *pList;
  
  pCover = Mvc_CoverClone(p);
  pCube = (Mvc_Cube_t *)&p->lCubes;
  while (pCube = pCube->pNext, pCube != (Mvc_Cube_t *)0x0) {
    if ((pCube->pData[iValue >> 5] & 1 << ((byte)iValue & 0x1f)) != 0) {
      pMVar2 = Mvc_CubeDup(pCover,pCube);
      pMVar3 = (Mvc_Cube_t *)&pCover->lCubes;
      if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar3 = (pCover->lCubes).pTail;
      }
      pMVar3->pNext = pMVar2;
      (pCover->lCubes).pTail = pMVar2;
      pMVar2->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
      pMVar2->pData[iValueOther >> 5] =
           pMVar2->pData[iValueOther >> 5] | 1 << ((byte)iValueOther & 0x1f);
    }
  }
  return pCover;
}

Assistant:

Mvc_Cover_t * Mvc_CoverCofactor( Mvc_Cover_t * p, int iValue, int iValueOther )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    // clone the cover
    pCover = Mvc_CoverClone( p );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
        if ( Mvc_CubeBitValue( pCube, iValue ) )
        {
            pCubeCopy = Mvc_CubeDup( pCover, pCube );
            Mvc_CoverAddCubeTail( pCover, pCubeCopy );
            Mvc_CubeBitInsert( pCubeCopy, iValueOther );
        }
    return pCover;
}